

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_psnr_enc.c
# Opt level: O3

double AccumulateSSE(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,int w,int h)

{
  uint32_t uVar1;
  double dVar2;
  
  if (0 < h) {
    dVar2 = 0.0;
    do {
      uVar1 = (*VP8AccumulateSSE)(src,ref,w);
      dVar2 = dVar2 + (double)uVar1;
      src = src + src_stride;
      ref = ref + ref_stride;
      h = h + -1;
    } while (h != 0);
    return dVar2;
  }
  return 0.0;
}

Assistant:

static double AccumulateSSE(const uint8_t* src, int src_stride,
                            const uint8_t* ref, int ref_stride,
                            int w, int h) {
  int y;
  double total_sse = 0.;
  for (y = 0; y < h; ++y) {
    total_sse += VP8AccumulateSSE(src, ref, w);
    src += src_stride;
    ref += ref_stride;
  }
  return total_sse;
}